

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

tests * lest::make_tests<lest::test[3]>(tests *__return_storage_ptr__,test (*c) [3])

{
  test *in_RCX;
  vector<lest::test,_std::allocator<lest::test>_> local_40;
  vector<lest::test,_std::allocator<lest::test>_> local_28;
  
  make<std::vector<lest::test,std::allocator<lest::test>>,lest::test>
            (&local_28,(lest *)c,c[1],in_RCX);
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(&local_40,&local_28);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_28);
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(__return_storage_ptr__,&local_40);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

inline int run( tests const & specification, int argc, char ** argv, std::ostream & os = std::cout )
{
    return run( specification, make_texts( argv + 1, argv + argc ), os  );
}